

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O2

void __thiscall
ApiLayerManifestFile::ApiLayerManifestFile
          (ApiLayerManifestFile *this,ManifestFileType type,string *filename,string *layer_name,
          string *description,JsonVersion *api_version,uint32_t *implementation_version,
          string *library_path)

{
  uint32_t uVar1;
  
  ManifestFile::ManifestFile(&this->super_ManifestFile,type,filename,library_path);
  (this->_api_version).patch = api_version->patch;
  uVar1 = api_version->minor;
  (this->_api_version).major = api_version->major;
  (this->_api_version).minor = uVar1;
  std::__cxx11::string::string((string *)&this->_layer_name,(string *)layer_name);
  std::__cxx11::string::string((string *)&this->_description,(string *)description);
  this->_implementation_version = *implementation_version;
  return;
}

Assistant:

ApiLayerManifestFile::ApiLayerManifestFile(ManifestFileType type, const std::string &filename, const std::string &layer_name,
                                           const std::string &description, const JsonVersion &api_version,
                                           const uint32_t &implementation_version, const std::string &library_path)
    : ManifestFile(type, filename, library_path),
      _api_version(api_version),
      _layer_name(layer_name),
      _description(description),
      _implementation_version(implementation_version) {}